

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::WithFunctionClauseSyntax::getChild
          (ConstTokenOrSyntax *__return_storage_ptr__,WithFunctionClauseSyntax *this,size_t index)

{
  Token token;
  SyntaxNode *node;
  size_t index_local;
  WithFunctionClauseSyntax *this_local;
  
  if (index == 0) {
    token.kind = (this->with).kind;
    token._2_1_ = (this->with).field_0x2;
    token.numFlags.raw = (this->with).numFlags.raw;
    token.rawLen = (this->with).rawLen;
    token.info = (this->with).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token);
  }
  else if (index == 1) {
    node = (SyntaxNode *)not_null<slang::syntax::NameSyntax_*>::get(&this->name);
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,node);
  }
  else {
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

ConstTokenOrSyntax WithFunctionClauseSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return with;
        case 1: return name.get();
        default: return nullptr;
    }
}